

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_severity.cc
# Opt level: O0

ostream * absl::lts_20240722::operator<<(ostream *os,LogSeverityAtMost s)

{
  ostream *os_00;
  LogSeverityAtMost s_local;
  ostream *os_local;
  
  if (s == kNegativeInfinity) {
    os_local = std::operator<<(os,"NEGATIVE_INFINITY");
  }
  else {
    os_local = os;
    if ((uint)s < 4) {
      os_00 = std::operator<<(os,"<=");
      os_local = operator<<(os_00,s);
    }
  }
  return os_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, absl::LogSeverityAtMost s) {
  switch (s) {
    case absl::LogSeverityAtMost::kInfo:
    case absl::LogSeverityAtMost::kWarning:
    case absl::LogSeverityAtMost::kError:
    case absl::LogSeverityAtMost::kFatal:
      return os << "<=" << static_cast<absl::LogSeverity>(s);
    case absl::LogSeverityAtMost::kNegativeInfinity:
      return os << "NEGATIVE_INFINITY";
  }
  return os;
}